

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

UText * utf8TextClone(UText *dest,UText *src,UBool deep,UErrorCode *status)

{
  UText *pUVar1;
  int64_t iVar2;
  void *__dest;
  size_t s;
  
  pUVar1 = shallowTextClone(dest,src,status);
  if ((deep != '\0') && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    iVar2 = (*src->pFuncs->nativeLength)(src);
    s = (size_t)((int)iVar2 + 1);
    __dest = uprv_malloc_63(s);
    if (__dest == (void *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      memcpy(__dest,src->context,s);
      pUVar1->context = __dest;
      *(byte *)&pUVar1->providerProperties = (byte)pUVar1->providerProperties | 0x20;
    }
  }
  return pUVar1;
}

Assistant:

static UText * U_CALLCONV
utf8TextClone(UText *dest, const UText *src, UBool deep, UErrorCode *status)
{
    // First do a generic shallow clone.  Does everything needed for the UText struct itself.
    dest = shallowTextClone(dest, src, status);

    // For deep clones, make a copy of the string.
    //  The copied storage is owned by the newly created clone.
    //
    // TODO:  There is an isssue with using utext_nativeLength().
    //        That function is non-const in cases where the input was NUL terminated
    //          and the length has not yet been determined.
    //        This function (clone()) is const.
    //        There potentially a thread safety issue lurking here.
    //
    if (deep && U_SUCCESS(*status)) {
        int32_t  len = (int32_t)utext_nativeLength((UText *)src);
        char *copyStr = (char *)uprv_malloc(len+1);
        if (copyStr == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
        } else {
            uprv_memcpy(copyStr, src->context, len+1);
            dest->context = copyStr;
            dest->providerProperties |= I32_FLAG(UTEXT_PROVIDER_OWNS_TEXT);
        }
    }
    return dest;
}